

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

gdsBOUNDARY *
draw2ptBox(gdsBOUNDARY *__return_storage_ptr__,int layer,int blX,int blY,int trX,int trY)

{
  pointer *ppiVar1;
  reference pvVar2;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> ptsY;
  vector<int,_std::allocator<int>_> ptsX;
  int trY_local;
  int trX_local;
  int blY_local;
  int blX_local;
  int layer_local;
  
  ppiVar1 = &ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)ppiVar1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_58);
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)ppiVar1,5);
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)local_58,5);
  ppiVar1 = &ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)ppiVar1,0);
  *pvVar2 = blX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_58,0);
  *pvVar2 = blY;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)ppiVar1,1);
  *pvVar2 = trX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_58,1);
  *pvVar2 = blY;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)ppiVar1,2);
  *pvVar2 = trX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_58,2);
  *pvVar2 = trY;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)ppiVar1,3);
  *pvVar2 = blX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_58,3);
  *pvVar2 = trY;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)ppiVar1,4);
  *pvVar2 = blX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_58,4);
  *pvVar2 = blY;
  drawBoundary(__return_storage_ptr__,layer,(vector<int,_std::allocator<int>_> *)ppiVar1,
               (vector<int,_std::allocator<int>_> *)local_58);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

gdsBOUNDARY draw2ptBox(int layer, int blX, int blY, int trX, int trY)
{
  vector<int> ptsX;
  vector<int> ptsY;

  ptsX.resize(5);
  ptsY.resize(5);

  ptsX[0] = blX;
  ptsY[0] = blY;
  ptsX[1] = trX;
  ptsY[1] = blY;
  ptsX[2] = trX;
  ptsY[2] = trY;
  ptsX[3] = blX;
  ptsY[3] = trY;
  ptsX[4] = blX;
  ptsY[4] = blY;

  return drawBoundary(layer, ptsX, ptsY);
}